

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3MemoryAlarm(_func_void_void_ptr_sqlite3_int64_int *xCallback,void *pArg,
                      sqlite3_int64 iThreshold)

{
  int iVar1;
  bool local_25;
  int nUsed;
  sqlite3_int64 iThreshold_local;
  void *pArg_local;
  _func_void_void_ptr_sqlite3_int64_int *xCallback_local;
  
  sqlite3_mutex_enter(mem0.mutex);
  mem0.alarmThreshold = iThreshold;
  mem0.alarmCallback = xCallback;
  mem0.alarmArg = pArg;
  iVar1 = sqlite3StatusValue(0);
  local_25 = 0 < iThreshold && iThreshold <= iVar1;
  mem0.nearlyFull = (int)local_25;
  sqlite3_mutex_leave(mem0.mutex);
  return 0;
}

Assistant:

static int sqlite3MemoryAlarm(
  void(*xCallback)(void *pArg, sqlite3_int64 used,int N),
  void *pArg,
  sqlite3_int64 iThreshold
){
  int nUsed;
  sqlite3_mutex_enter(mem0.mutex);
  mem0.alarmCallback = xCallback;
  mem0.alarmArg = pArg;
  mem0.alarmThreshold = iThreshold;
  nUsed = sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED);
  mem0.nearlyFull = (iThreshold>0 && iThreshold<=nUsed);
  sqlite3_mutex_leave(mem0.mutex);
  return SQLITE_OK;
}